

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall ExprTest_Cast_Test::TestBody(ExprTest_Cast_Test *this)

{
  NumericConstant other;
  bool bVar1;
  undefined1 uVar2;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  NumericConstant n;
  AssertionResult gtest_ar;
  Expr e;
  ExprBase in_stack_fffffffffffffed8;
  AssertHelper *in_stack_fffffffffffffee0;
  AssertHelper *this_00;
  BasicExprFactory<std::allocator<char>_> *in_stack_fffffffffffffee8;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  char *in_stack_fffffffffffffef8;
  int line;
  char *in_stack_ffffffffffffff00;
  AssertionResult *this_02;
  Type in_stack_ffffffffffffff0c;
  Type type;
  AssertHelper *in_stack_ffffffffffffff10;
  AssertHelper local_b0;
  Message *in_stack_ffffffffffffff58;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff60;
  AssertionResult local_78;
  undefined8 local_68;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_60;
  undefined8 local_38;
  ExprBase local_30;
  AssertionResult local_28;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_18;
  undefined8 local_10;
  
  local_18.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
                 (in_stack_fffffffffffffee8,(double)in_stack_fffffffffffffee0);
  other.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._7_1_ =
       in_stack_fffffffffffffef7;
  other.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._0_7_ =
       in_stack_fffffffffffffef0;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_stack_fffffffffffffee8,other,
             (type_conflict)((ulong)in_stack_fffffffffffffee0 >> 0x20));
  local_38 = local_10;
  local_30.impl_ =
       (Impl *)mp::Cast<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                         ((Expr)in_stack_fffffffffffffed8.impl_);
  testing::internal::EqHelper<false>::
  Compare<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_stack_fffffffffffffef8,
             (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_stack_fffffffffffffee8,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffee0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff10);
    in_stack_ffffffffffffff10 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x12fdd2);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00,
               (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff60.ptr_,in_stack_ffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffee0);
    testing::Message::~Message((Message *)0x12fe2f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12fe87);
  local_68 = local_10;
  local_60.super_ExprBase.impl_ =
       (ExprBase)mp::Cast<mp::NumericConstant>((Expr)in_stack_fffffffffffffed8.impl_);
  mp::NumericConstant::value((NumericConstant *)0x12fec4);
  this_02 = &local_78;
  testing::internal::EqHelper<false>::Compare<int,double>
            (in_stack_fffffffffffffef8,
             (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
             (int *)in_stack_fffffffffffffee8,(double *)in_stack_fffffffffffffee0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  type = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff0c);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff10);
    in_stack_fffffffffffffef8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x12ff63);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff10,type,&this_02->success_,
               (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff60.ptr_,in_stack_ffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffee0);
    testing::Message::~Message((Message *)0x12ffc0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x130018);
  local_b0.data_ = (AssertHelperData *)0x0;
  this_00 = &local_b0;
  mp::
  BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
  ::BasicUnaryExpr((BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
                    *)0x130030);
  mp::
  Cast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
            ((Expr)in_stack_fffffffffffffed8.impl_);
  this_01 = (AssertionResult *)&stack0xffffffffffffff58;
  testing::internal::EqHelper<false>::
  Compare<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>,mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
            (in_stack_fffffffffffffef8,
             (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
             (BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
              *)this_01,
             (BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
              *)this_00);
  line = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff10);
    testing::AssertionResult::failure_message((AssertionResult *)0x1300d9);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff10,type,&this_02->success_,line,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffef0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff60.ptr_,in_stack_ffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x130125);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x130174);
  return;
}

Assistant:

TEST_F(ExprTest, Cast) {
  Expr e = factory_.MakeNumericConstant(42);
  EXPECT_EQ(e, mp::Cast<NumericExpr>(e));
  mp::NumericConstant n = mp::Cast<mp::NumericConstant>(e);
  EXPECT_EQ(42, n.value());
  EXPECT_EQ(mp::UnaryExpr(), mp::Cast<mp::UnaryExpr>(e));
}